

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  Net *pNVar1;
  int iVar2;
  ulong uVar3;
  Layer *pLVar4;
  char *pcVar5;
  long lVar6;
  size_t sStack_980;
  int bottom_blob_index;
  int local_970;
  int typeindex;
  int blob_count;
  int top_count;
  int bottom_count;
  int layer_count;
  Net *local_958;
  int local_950;
  int magic;
  Layer *local_948;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_940;
  ulong local_938;
  ParamDict pd;
  
  magic = 0;
  local_958 = this;
  iVar2 = (*dr->_vptr_DataReader[3])(dr,&magic,4);
  if (iVar2 == 4) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar2 = (*dr->_vptr_DataReader[3])(dr,&layer_count,4);
      if (iVar2 == 4) {
        iVar2 = (*dr->_vptr_DataReader[3])(dr,&blob_count,4);
        pNVar1 = local_958;
        if (iVar2 == 4) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            local_940 = &local_958->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_940,(long)layer_count);
            this_00 = &pNVar1->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)blob_count);
            ParamDict::ParamDict(&pd);
            uVar3 = 0;
            do {
              local_970 = (int)uVar3;
              iVar2 = layer_count;
              if (layer_count <= local_970) {
LAB_00113676:
                ParamDict::~ParamDict(&pd);
                return -(uint)((int)uVar3 < iVar2);
              }
              local_950 = layer_count;
              local_938 = uVar3;
              iVar2 = (*dr->_vptr_DataReader[3])(dr,&typeindex,4);
              if (iVar2 != 4) {
                pcVar5 = "read typeindex failed\n";
LAB_0011374e:
                sStack_980 = 0x16;
LAB_00113664:
                fwrite(pcVar5,sStack_980,1,_stderr);
                uVar3 = local_938;
                iVar2 = local_950;
                goto LAB_00113676;
              }
              iVar2 = (*dr->_vptr_DataReader[3])(dr,&bottom_count,4);
              if (iVar2 != 4) {
                pcVar5 = "read bottom_count failed\n";
                sStack_980 = 0x19;
                goto LAB_00113664;
              }
              iVar2 = (*dr->_vptr_DataReader[3])(dr,&top_count,4);
              if (iVar2 != 4) {
                pcVar5 = "read top_count failed\n";
                goto LAB_0011374e;
              }
              pLVar4 = create_layer(typeindex);
              if ((pLVar4 == (Layer *)0x0) &&
                 (pLVar4 = create_custom_layer(local_958,typeindex & 0xfffffeff),
                 pLVar4 == (Layer *)0x0)) {
                fprintf(_stderr,"layer %d not exists or registered\n",(ulong)(uint)typeindex);
                clear(local_958);
                uVar3 = local_938;
                iVar2 = local_950;
                goto LAB_00113676;
              }
              std::vector<int,_std::allocator<int>_>::resize(&pLVar4->bottoms,(long)bottom_count);
              local_948 = pLVar4;
              for (lVar6 = 0; lVar6 < bottom_count; lVar6 = lVar6 + 1) {
                iVar2 = (*dr->_vptr_DataReader[3])(dr,&bottom_blob_index,4);
                if (iVar2 != 4) {
                  pcVar5 = "read bottom_blob_index failed\n";
                  sStack_980 = 0x1e;
                  goto LAB_00113664;
                }
                std::vector<int,_std::allocator<int>_>::push_back
                          (&(this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                            _M_impl.super__Vector_impl_data._M_start[bottom_blob_index].consumers,
                           &local_970);
                (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6] = bottom_blob_index;
              }
              this_01 = &local_948->tops;
              std::vector<int,_std::allocator<int>_>::resize(this_01,(long)top_count);
              for (lVar6 = 0; lVar6 < top_count; lVar6 = lVar6 + 1) {
                iVar2 = (*dr->_vptr_DataReader[3])(dr,&bottom_blob_index,4);
                if (iVar2 != 4) {
                  pcVar5 = "read top_blob_index failed\n";
                  sStack_980 = 0x1b;
                  goto LAB_00113664;
                }
                (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start[bottom_blob_index].producer = local_970;
                (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar6] = bottom_blob_index;
              }
              iVar2 = ParamDict::load_param_bin(&pd,dr);
              pLVar4 = local_948;
              if (iVar2 == 0) {
                iVar2 = (*local_948->_vptr_Layer[2])(local_948,&pd);
                if (iVar2 != 0) {
                  pcVar5 = "layer load_param failed\n";
                  sStack_980 = 0x18;
                  goto LAB_00113631;
                }
                (local_940->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                _M_impl.super__Vector_impl_data._M_start[local_970] = pLVar4;
              }
              else {
                pcVar5 = "ParamDict load_param failed\n";
                sStack_980 = 0x1c;
LAB_00113631:
                fwrite(pcVar5,sStack_980,1,_stderr);
              }
              uVar3 = (ulong)(local_970 + 1);
            } while( true );
          }
          pcVar5 = "invalid layer_count or blob_count\n";
          sStack_980 = 0x22;
        }
        else {
          pcVar5 = "read blob_count failed\n";
          sStack_980 = 0x17;
        }
      }
      else {
        pcVar5 = "read layer_count failed\n";
        sStack_980 = 0x18;
      }
    }
    else {
      pcVar5 = "param is too old, please regenerate\n";
      sStack_980 = 0x24;
    }
  }
  else {
    pcVar5 = "read magic failed\n";
    sStack_980 = 0x12;
  }
  fwrite(pcVar5,sStack_980,1,_stderr);
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        fprintf(stderr, "read " #buf " failed\n"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}